

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thr_unlink.c
# Opt level: O0

void * rm_thread_forward(void *objs_ptr)

{
  int error;
  obj *poVar1;
  int local_1c;
  int i;
  obj *objs;
  void *objs_ptr_local;
  
  for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
    ll_ref_objlist(&list,(obj *)((long)objs_ptr + (long)local_1c * 0x20));
  }
  error = barrier_wait(&barrier);
  must_succeed(error,"pthread_barrier_wait");
  for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
    poVar1 = ll_unlink_objlist(&list,(obj *)((long)objs_ptr + (long)local_1c * 0x20));
    if (poVar1 == (obj *)0x0) {
      unlink_fail((obj *)((long)objs_ptr + (long)local_1c * 0x20));
    }
  }
  return (void *)0x0;
}

Assistant:

void*
rm_thread_forward(void *objs_ptr)
{
	struct obj *objs = objs_ptr;
	int i;

	for (i = 0; i < N; i++)
		LL_REF(objlist, &list, &objs[i]);
	must_succeed(barrier_wait(&barrier), "pthread_barrier_wait");

	for (i = 0; i < N; i++) {
		if (!LL_UNLINK(objlist, &list, &objs[i]))
			unlink_fail(&objs[i]);
	}
	return NULL;
}